

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O2

bool __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTriang>_>::dataequal
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTriang>_> *this,TPZMaterialData *d1,
          TPZMaterialData *d2)

{
  int iVar1;
  ulong uVar2;
  size_t lineN;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  lineN = 0x1be;
  if ((d1->p == d2->p) &&
     (lineN = 0x1c7,
     (d1->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow ==
     (d2->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow)) {
    uVar2 = (d1->x).super_TPZVec<double>.fNElements;
    iVar1 = (int)uVar2;
    if ((long)iVar1 == (d2->x).super_TPZVec<double>.fNElements) {
      uVar3 = 0;
      uVar2 = uVar2 & 0xffffffff;
      if (iVar1 < 1) {
        uVar2 = uVar3;
      }
      dVar4 = 0.0;
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        dVar5 = (d1->x).super_TPZVec<double>.fStore[uVar3] -
                (d2->x).super_TPZVec<double>.fStore[uVar3];
        dVar4 = dVar4 + dVar5 * dVar5;
      }
      lineN = 0x1ce;
      if (dVar4 <= 1e-08) {
        return true;
      }
    }
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzcompelpostproc.h"
             ,lineN);
}

Assistant:

inline bool TPZCompElPostProc<TCOMPEL>::dataequal(TPZMaterialData &d1,TPZMaterialData &d2)
{
    const REAL SMALLNUMBER = 1.e-8;
    int i;
    if(d1.p!=d2.p)
    {
        DebugStop();
        return 0;
    }
    REAL res = 0;
    int dim = d1.x.NElements();
    int64_t nshape = d1.phi.Rows();
    int64_t nshape2 = d2.phi.Rows();
    if(dim != d2.x.NElements() || nshape!= nshape2)
    {
        DebugStop();
        return 0; // dimensions and number of integration points shall match
    }
    
    for(i = 0; i < dim; i++)res += pow(d1.x[i]-d2.x[i],(REAL)2.0); // integration points must be at the same locations
    if(res > SMALLNUMBER)
    {
        DebugStop();
        return 0;
    }
    return 1;
}